

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenX86.cc
# Opt level: O0

void __thiscall mcc::CodeGenX86::GenCondJump(CodeGenX86 *this,int r,TokenType type,int label)

{
  ostream *poVar1;
  int label_local;
  TokenType type_local;
  int r_local;
  CodeGenX86 *this_local;
  
  poVar1 = std::operator<<(this->out_,"\ttest\t");
  poVar1 = std::operator<<(poVar1,(string *)(this->kRegisters + r));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,(string *)(this->kRegisters + r));
  std::operator<<(poVar1,"\n");
  if (type == T_AND) {
    poVar1 = std::operator<<(this->out_,"\tje\tL");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,label);
    std::operator<<(poVar1,"\n");
  }
  else {
    if (type != T_OR) {
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "Internal error: unexpected operator type in logical expr");
      poVar1 = operator<<(poVar1,type);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    poVar1 = std::operator<<(this->out_,"\tjne\tL");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,label);
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void CodeGenX86::GenCondJump(int r, TokenType type, int label) {
  out_ << "\ttest\t" << kRegisters[r] << ", " << kRegisters[r] << "\n";
  if (type == TokenType::T_AND) {
    out_ << "\tje\tL" << label << "\n";
  } else if (type == TokenType::T_OR) {
    out_ << "\tjne\tL" << label << "\n";
  } else {
    std::cerr << "Internal error: unexpected operator type in logical expr" << type << std::endl;
    exit(1);
  }
}